

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer.c
# Opt level: O3

Triangle * rasterize(Triangle *__return_storage_ptr__,Camera *camera,Triangle triangle)

{
  ushort uVar1;
  Vector worldVec;
  Vector local_1b8;
  Vector local_188;
  Vector local_158;
  Vector local_128;
  Vector local_f8;
  Vector local_c8;
  Vector local_98;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  longdouble local_2c;
  
  memcpy(__return_storage_ptr__,&triangle,0x150);
  WorldPos2NDCPos(&local_1b8,camera,__return_storage_ptr__->vertexes[0]);
  local_60 = (uint)camera->image_width;
  local_2c = (longdouble)0.5;
  local_64 = (uint)camera->image_height;
  *(longdouble *)&__return_storage_ptr__->vertexes[0].x =
       (local_1b8.x._0_10_ + (longdouble)1) * local_2c * (longdouble)local_60;
  *(longdouble *)&__return_storage_ptr__->vertexes[0].y =
       (local_1b8.y._0_10_ + (longdouble)1) * local_2c * (longdouble)local_64;
  *(longdouble *)&__return_storage_ptr__->vertexes[0].z = -local_1b8.z._0_10_;
  WorldPos2NDCPos(&local_188,camera,__return_storage_ptr__->vertexes[1]);
  local_58 = (uint)camera->image_width;
  local_5c = (uint)camera->image_height;
  *(longdouble *)&__return_storage_ptr__->vertexes[1].x =
       (local_188.x._0_10_ + (longdouble)1) * local_2c * (longdouble)local_58;
  *(longdouble *)&__return_storage_ptr__->vertexes[1].y =
       (local_188.y._0_10_ + (longdouble)1) * local_2c * (longdouble)local_5c;
  *(longdouble *)&__return_storage_ptr__->vertexes[1].z = -local_188.z._0_10_;
  WorldPos2NDCPos(&local_158,camera,__return_storage_ptr__->vertexes[2]);
  local_50 = (uint)camera->image_width;
  local_54 = (uint)camera->image_height;
  *(longdouble *)&__return_storage_ptr__->vertexes[2].x =
       (local_158.x._0_10_ + (longdouble)1) * local_2c * (longdouble)local_50;
  *(longdouble *)&__return_storage_ptr__->vertexes[2].y =
       (local_158.y._0_10_ + (longdouble)1) * local_2c * (longdouble)local_54;
  *(longdouble *)&__return_storage_ptr__->vertexes[2].z = -local_158.z._0_10_;
  worldVec.x._8_8_ = triangle.surfaceNormal.x._8_8_;
  worldVec.x._0_8_ = triangle.surfaceNormal.x._0_8_;
  worldVec.y._0_8_ = triangle.surfaceNormal.y._0_8_;
  worldVec.y._8_8_ = triangle.surfaceNormal.y._8_8_;
  worldVec.z._0_8_ = triangle.surfaceNormal.z._0_8_;
  worldVec.z._8_8_ = triangle.surfaceNormal.z._8_8_;
  WorldPos2NDCPos(&local_128,camera,worldVec);
  local_48 = (uint)camera->image_width;
  local_4c = (uint)camera->image_height;
  *(longdouble *)&(__return_storage_ptr__->surfaceNormal).x =
       (local_128.x._0_10_ + (longdouble)1) * local_2c * (longdouble)local_48;
  *(longdouble *)&(__return_storage_ptr__->surfaceNormal).y =
       (local_128.y._0_10_ + (longdouble)1) * local_2c * (longdouble)local_4c;
  *(longdouble *)&(__return_storage_ptr__->surfaceNormal).z = -local_128.z._0_10_;
  WorldPos2NDCPos(&local_f8,camera,__return_storage_ptr__->vertexNormals[0]);
  local_40 = (uint)camera->image_width;
  local_44 = (uint)camera->image_height;
  *(longdouble *)&__return_storage_ptr__->vertexNormals[0].x =
       (local_f8.x._0_10_ + (longdouble)1) * local_2c * (longdouble)local_40;
  *(longdouble *)&__return_storage_ptr__->vertexNormals[0].y =
       (local_f8.y._0_10_ + (longdouble)1) * local_2c * (longdouble)local_44;
  *(longdouble *)&__return_storage_ptr__->vertexNormals[0].z = -local_f8.z._0_10_;
  WorldPos2NDCPos(&local_c8,camera,__return_storage_ptr__->vertexNormals[1]);
  local_38 = (uint)camera->image_width;
  local_3c = (uint)camera->image_height;
  *(longdouble *)&__return_storage_ptr__->vertexNormals[1].x =
       (local_c8.x._0_10_ + (longdouble)1) * local_2c * (longdouble)local_38;
  *(longdouble *)&__return_storage_ptr__->vertexNormals[1].y =
       (local_c8.y._0_10_ + (longdouble)1) * local_2c * (longdouble)local_3c;
  *(longdouble *)&__return_storage_ptr__->vertexNormals[1].z = -local_c8.z._0_10_;
  WorldPos2NDCPos(&local_98,camera,__return_storage_ptr__->vertexNormals[2]);
  uVar1 = camera->image_height;
  *(longdouble *)&__return_storage_ptr__->vertexNormals[2].x =
       (local_98.x._0_10_ + (longdouble)1) * local_2c * (longdouble)camera->image_width;
  *(longdouble *)&__return_storage_ptr__->vertexNormals[2].y =
       (local_98.y._0_10_ + (longdouble)1) * local_2c * (longdouble)uVar1;
  *(longdouble *)&__return_storage_ptr__->vertexNormals[2].z = -local_98.z._0_10_;
  return __return_storage_ptr__;
}

Assistant:

Triangle rasterize(const Camera *camera, const Triangle triangle) {
  Triangle new = triangle;
  new.vertexes[0] = NDCPos2ImagePos(camera, WorldPos2NDCPos(camera, new.vertexes[0]));
  new.vertexes[1] = NDCPos2ImagePos(camera, WorldPos2NDCPos(camera, new.vertexes[1]));
  new.vertexes[2] = NDCPos2ImagePos(camera, WorldPos2NDCPos(camera, new.vertexes[2]));
  new.surfaceNormal = NDCPos2ImagePos(camera, WorldPos2NDCPos(camera, new.surfaceNormal));
  new.vertexNormals[0] = NDCPos2ImagePos(camera, WorldPos2NDCPos(camera, new.vertexNormals[0]));
  new.vertexNormals[1] = NDCPos2ImagePos(camera, WorldPos2NDCPos(camera, new.vertexNormals[1]));
  new.vertexNormals[2] = NDCPos2ImagePos(camera, WorldPos2NDCPos(camera, new.vertexNormals[2]));
  return new;
}